

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::char_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          size_t size,align_spec *spec,char_writer *f)

{
  byte bVar1;
  type __s;
  size_t __len;
  size_t __n;
  char __tmp;
  size_t __len_1;
  ulong uVar2;
  type pcVar3;
  
  uVar2 = (ulong)spec->width_;
  __n = uVar2 - size;
  if (uVar2 < size || __n == 0) {
    pcVar3 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,size);
    *pcVar3 = f->value;
    return;
  }
  __s = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                  ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,uVar2);
  bVar1 = (byte)spec->fill_;
  pcVar3 = __s;
  if (spec->align_ == ALIGN_CENTER) {
    uVar2 = __n >> 1;
    if (1 < __n) {
      pcVar3 = __s + uVar2;
      memset(__s,(uint)bVar1,uVar2);
    }
    *pcVar3 = f->value;
    __n = __n - uVar2;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      memset(__s,(uint)bVar1,__n);
      __s[__n] = f->value;
      return;
    }
    *__s = f->value;
  }
  memset(pcVar3 + 1,(uint)bVar1,__n);
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F &&f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}